

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O2

Matrix44<float> * Imath_3_2::outerProduct<float>(Vec4<float> *a,Vec4<float> *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Matrix44<float> *in_RDI;
  float fVar9;
  
  fVar3 = a->x;
  fVar4 = a->w;
  fVar1 = a->y;
  fVar2 = a->z;
  fVar5 = b->x;
  fVar6 = b->y;
  fVar7 = b->z;
  fVar8 = b->w;
  fVar9 = fVar3 * fVar8;
  in_RDI->x[0][0] = fVar3 * fVar5;
  in_RDI->x[0][1] = fVar3 * fVar6;
  in_RDI->x[0][2] = fVar3 * fVar7;
  in_RDI->x[0][3] = fVar9;
  *(ulong *)in_RDI->x[1] = CONCAT44(fVar1 * fVar6,fVar1 * fVar5);
  in_RDI->x[1][2] = fVar7 * fVar1;
  in_RDI->x[1][3] = fVar9;
  *(ulong *)in_RDI->x[2] = CONCAT44(fVar2 * fVar6,fVar2 * fVar5);
  in_RDI->x[2][2] = fVar7 * fVar2;
  in_RDI->x[2][3] = fVar9;
  in_RDI->x[3][0] = fVar4 * fVar5;
  in_RDI->x[3][1] = fVar4 * fVar6;
  in_RDI->x[3][2] = fVar4 * fVar7;
  in_RDI->x[3][3] = fVar4 * fVar8;
  return in_RDI;
}

Assistant:

Matrix44<T>
outerProduct (const Vec4<T>& a, const Vec4<T>& b)
{
    return Matrix44<T> (
        a.x * b.x,
        a.x * b.y,
        a.x * b.z,
        a.x * b.w,
        a.y * b.x,
        a.y * b.y,
        a.y * b.z,
        a.x * b.w,
        a.z * b.x,
        a.z * b.y,
        a.z * b.z,
        a.x * b.w,
        a.w * b.x,
        a.w * b.y,
        a.w * b.z,
        a.w * b.w);
}